

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O0

Node * __thiscall ScapeGoatTree::findMax(ScapeGoatTree *this,Node *node)

{
  Node *node_local;
  ScapeGoatTree *this_local;
  
  if (node == (Node *)0x0) {
    this_local = (ScapeGoatTree *)0x0;
  }
  else {
    this_local = (ScapeGoatTree *)node;
    if (node->rightChild != (Node *)0x0) {
      this_local = (ScapeGoatTree *)findMax(this,node->rightChild);
    }
  }
  return (Node *)this_local;
}

Assistant:

ScapeGoatTree::Node *ScapeGoatTree::findMax(Node *node) {
    if (node == nullptr) {
        return nullptr;
    } else if (node->rightChild == nullptr) {
        return node;
    } else {
        return findMax(node->rightChild);
    }
}